

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_tree(REF_INTERP ref_interp,REF_BOOL *increase_fuzz)

{
  REF_GRID pRVar1;
  REF_MPI ref_mpi_00;
  REF_NODE ref_node;
  REF_NODE pRVar2;
  uint uVar3;
  REF_LIST local_240;
  REF_LIST local_238;
  REF_LIST local_230;
  double local_228;
  REF_LIST local_218;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rsb;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT item;
  REF_INT i;
  REF_DBL *recv_bary;
  REF_DBL *send_bary;
  REF_INT *recv_node;
  REF_INT *send_node;
  REF_INT *recv_cell;
  REF_INT *send_cell;
  REF_INT *recv_proc;
  REF_INT *my_proc;
  REF_INT *send_proc;
  int local_158;
  REF_INT nrecv;
  REF_INT nsend;
  REF_INT total_node;
  REF_INT *source;
  REF_INT *global_node;
  REF_INT *local_node;
  REF_DBL *global_xyz;
  REF_DBL *local_xyz;
  REF_DBL *pRStack_120;
  REF_INT ntarget;
  REF_DBL *best_bary;
  REF_INT *from_proc;
  REF_INT *best_cell;
  REF_INT *best_node;
  REF_INT local_f8;
  REF_INT node;
  REF_INT nodes [27];
  REF_LIST local_80;
  REF_LIST ref_list;
  REF_DBL bary [4];
  REF_SEARCH ref_search;
  REF_NODE to_node;
  REF_CELL from_cell;
  REF_NODE from_node;
  REF_MPI ref_mpi;
  REF_GRID to_grid;
  REF_GRID from_grid;
  REF_BOOL *increase_fuzz_local;
  REF_INTERP ref_interp_local;
  
  pRVar1 = ref_interp->from_grid;
  ref_mpi_00 = ref_interp->ref_mpi;
  ref_node = pRVar1->node;
  pRVar2 = ref_interp->to_grid->node;
  bary[3] = (REF_DBL)ref_interp->ref_search;
  if (pRVar1->twod == 0) {
    to_node = (REF_NODE)ref_interp->from_tet;
  }
  else {
    to_node = (REF_NODE)ref_interp->from_tri;
  }
  *increase_fuzz = 0;
  ref_interp_local._4_4_ = ref_list_create(&local_80);
  if (ref_interp_local._4_4_ == 0) {
    local_xyz._4_4_ = 0;
    for (best_node._4_4_ = 0; best_node._4_4_ < pRVar2->max; best_node._4_4_ = best_node._4_4_ + 1)
    {
      if ((((-1 < best_node._4_4_) && (best_node._4_4_ < pRVar2->max)) &&
          (-1 < pRVar2->global[best_node._4_4_])) &&
         ((pRVar2->ref_mpi->id == pRVar2->part[best_node._4_4_] &&
          (ref_interp->cell[best_node._4_4_] == -1)))) {
        local_xyz._4_4_ = local_xyz._4_4_ + 1;
      }
    }
    if (local_xyz._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x4a3,"ref_interp_tree","malloc local_node of REF_INT negative");
      ref_interp_local._4_4_ = 1;
    }
    else {
      global_node = (REF_INT *)malloc((long)local_xyz._4_4_ << 2);
      if (global_node == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x4a3,"ref_interp_tree","malloc local_node of REF_INT NULL");
        ref_interp_local._4_4_ = 2;
      }
      else if (local_xyz._4_4_ * 3 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x4a4,"ref_interp_tree","malloc local_xyz of REF_DBL negative");
        ref_interp_local._4_4_ = 1;
      }
      else {
        global_xyz = (REF_DBL *)malloc((long)(local_xyz._4_4_ * 3) << 3);
        if (global_xyz == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x4a4,"ref_interp_tree","malloc local_xyz of REF_DBL NULL");
          ref_interp_local._4_4_ = 2;
        }
        else {
          local_xyz._4_4_ = 0;
          for (best_node._4_4_ = 0; best_node._4_4_ < pRVar2->max;
              best_node._4_4_ = best_node._4_4_ + 1) {
            if (((-1 < best_node._4_4_) && (best_node._4_4_ < pRVar2->max)) &&
               ((-1 < pRVar2->global[best_node._4_4_] &&
                ((pRVar2->ref_mpi->id == pRVar2->part[best_node._4_4_] &&
                 (ref_interp->cell[best_node._4_4_] == -1)))))) {
              global_node[local_xyz._4_4_] = best_node._4_4_;
              global_xyz[local_xyz._4_4_ * 3] = pRVar2->real[best_node._4_4_ * 0xf];
              global_xyz[local_xyz._4_4_ * 3 + 1] = pRVar2->real[best_node._4_4_ * 0xf + 1];
              global_xyz[local_xyz._4_4_ * 3 + 2] = pRVar2->real[best_node._4_4_ * 0xf + 2];
              local_xyz._4_4_ = local_xyz._4_4_ + 1;
            }
          }
          ref_interp_local._4_4_ =
               ref_mpi_allconcat(ref_mpi_00,3,local_xyz._4_4_,global_xyz,&nrecv,(REF_INT **)&nsend,
                                 &local_node,3);
          if (ref_interp_local._4_4_ == 0) {
            if (_nsend != (REF_INT *)0x0) {
              free(_nsend);
            }
            ref_interp_local._4_4_ =
                 ref_mpi_allconcat(ref_mpi_00,1,local_xyz._4_4_,global_node,&nrecv,
                                   (REF_INT **)&nsend,&source,1);
            if (ref_interp_local._4_4_ == 0) {
              if (nrecv < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x4b7,"ref_interp_tree","malloc best_bary of REF_DBL negative");
                ref_interp_local._4_4_ = 1;
              }
              else {
                pRStack_120 = (REF_DBL *)malloc((long)nrecv << 3);
                if (pRStack_120 == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x4b7,"ref_interp_tree","malloc best_bary of REF_DBL NULL");
                  ref_interp_local._4_4_ = 2;
                }
                else if (nrecv < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x4b8,"ref_interp_tree","malloc best_node of REF_INT negative");
                  ref_interp_local._4_4_ = 1;
                }
                else {
                  best_cell = (REF_INT *)malloc((long)nrecv << 2);
                  if (best_cell == (REF_INT *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x4b8,"ref_interp_tree","malloc best_node of REF_INT NULL");
                    ref_interp_local._4_4_ = 2;
                  }
                  else if (nrecv < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x4b9,"ref_interp_tree","malloc best_cell of REF_INT negative");
                    ref_interp_local._4_4_ = 1;
                  }
                  else {
                    from_proc = (REF_INT *)malloc((long)nrecv << 2);
                    if (from_proc == (REF_INT *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x4b9,"ref_interp_tree","malloc best_cell of REF_INT NULL");
                      ref_interp_local._4_4_ = 2;
                    }
                    else if (nrecv < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x4ba,"ref_interp_tree","malloc from_proc of REF_INT negative");
                      ref_interp_local._4_4_ = 1;
                    }
                    else {
                      best_bary = (REF_DBL *)malloc((long)nrecv << 2);
                      if (best_bary == (REF_DBL *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x4ba,"ref_interp_tree","malloc from_proc of REF_INT NULL");
                        ref_interp_local._4_4_ = 2;
                      }
                      else {
                        for (best_node._4_4_ = 0; best_node._4_4_ < nrecv;
                            best_node._4_4_ = best_node._4_4_ + 1) {
                          best_cell[best_node._4_4_] = source[best_node._4_4_];
                          from_proc[best_node._4_4_] = -1;
                          pRStack_120[best_node._4_4_] = 1e+20;
                          uVar3 = ref_search_touching((REF_SEARCH)bary[3],local_80,
                                                      (REF_DBL *)
                                                      (local_node + (long)(best_node._4_4_ * 3) * 2)
                                                      ,ref_interp->search_fuzz);
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0x4c1,"ref_interp_tree",(ulong)uVar3,"tch");
                            return uVar3;
                          }
                          if (local_80->n < 1) {
                            from_proc[best_node._4_4_] = -1;
                          }
                          else {
                            if (pRVar1->twod == 0) {
                              uVar3 = ref_interp_enclosing_tet_in_list
                                                (ref_interp,local_80,
                                                 (REF_DBL *)
                                                 (local_node + (long)(best_node._4_4_ * 3) * 2),
                                                 from_proc + best_node._4_4_,(REF_DBL *)&ref_list);
                              if (uVar3 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x4cc,"ref_interp_tree",(ulong)uVar3,"best in list");
                                return uVar3;
                              }
                            }
                            else {
                              uVar3 = ref_interp_enclosing_tri_in_list
                                                (ref_interp,local_80,
                                                 (REF_DBL *)
                                                 (local_node + (long)(best_node._4_4_ * 3) * 2),
                                                 from_proc + best_node._4_4_,(REF_DBL *)&ref_list);
                              if (uVar3 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x4c7,"ref_interp_tree",(ulong)uVar3,"best in list");
                                return uVar3;
                              }
                            }
                            if (from_proc[best_node._4_4_] != -1) {
                              if (bary[0] <= (double)ref_list) {
                                local_218 = (REF_LIST)bary[0];
                              }
                              else {
                                local_218 = ref_list;
                              }
                              if (bary[2] <= bary[1]) {
                                local_228 = bary[2];
                              }
                              else {
                                local_228 = bary[1];
                              }
                              if (local_228 <= (double)local_218) {
                                if (bary[2] <= bary[1]) {
                                  local_240 = (REF_LIST)bary[2];
                                }
                                else {
                                  local_240 = (REF_LIST)bary[1];
                                }
                                local_238 = local_240;
                              }
                              else {
                                if (bary[0] <= (double)ref_list) {
                                  local_230 = (REF_LIST)bary[0];
                                }
                                else {
                                  local_230 = ref_list;
                                }
                                local_238 = local_230;
                              }
                              pRStack_120[best_node._4_4_] = -(double)local_238;
                            }
                          }
                          ref_interp->tree_cells = local_80->n + ref_interp->tree_cells;
                          uVar3 = ref_list_erase(local_80);
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0x4d6,"ref_interp_tree",(ulong)uVar3,"reset list");
                            return uVar3;
                          }
                        }
                        ref_interp_local._4_4_ =
                             ref_mpi_allminwho(ref_mpi_00,pRStack_120,(REF_INT *)best_bary,nrecv);
                        if (ref_interp_local._4_4_ == 0) {
                          local_158 = 0;
                          for (best_node._4_4_ = 0; best_node._4_4_ < nrecv;
                              best_node._4_4_ = best_node._4_4_ + 1) {
                            if (ref_mpi_00->id ==
                                *(int *)((long)best_bary + (long)best_node._4_4_ * 4)) {
                              local_158 = local_158 + 1;
                            }
                          }
                          if (local_158 * 4 < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0x4e0,"ref_interp_tree","malloc send_bary of REF_DBL negative");
                            ref_interp_local._4_4_ = 1;
                          }
                          else {
                            recv_bary = (REF_DBL *)malloc((long)(local_158 << 2) << 3);
                            if (recv_bary == (REF_DBL *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x4e0,"ref_interp_tree","malloc send_bary of REF_DBL NULL");
                              ref_interp_local._4_4_ = 2;
                            }
                            else if (local_158 < 0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x4e1,"ref_interp_tree","malloc send_cell of REF_INT negative"
                                    );
                              ref_interp_local._4_4_ = 1;
                            }
                            else {
                              recv_cell = (REF_INT *)malloc((long)local_158 << 2);
                              if (recv_cell == (REF_INT *)0x0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x4e1,"ref_interp_tree","malloc send_cell of REF_INT NULL");
                                ref_interp_local._4_4_ = 2;
                              }
                              else if (local_158 < 0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x4e2,"ref_interp_tree",
                                       "malloc send_node of REF_INT negative");
                                ref_interp_local._4_4_ = 1;
                              }
                              else {
                                recv_node = (REF_INT *)malloc((long)local_158 << 2);
                                if (recv_node == (REF_INT *)0x0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x4e2,"ref_interp_tree","malloc send_node of REF_INT NULL"
                                        );
                                  ref_interp_local._4_4_ = 2;
                                }
                                else if (local_158 < 0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x4e3,"ref_interp_tree",
                                         "malloc send_proc of REF_INT negative");
                                  ref_interp_local._4_4_ = 1;
                                }
                                else {
                                  my_proc = (REF_INT *)malloc((long)local_158 << 2);
                                  if (my_proc == (REF_INT *)0x0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0x4e3,"ref_interp_tree",
                                           "malloc send_proc of REF_INT NULL");
                                    ref_interp_local._4_4_ = 2;
                                  }
                                  else if (local_158 < 0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0x4e4,"ref_interp_tree",
                                           "malloc my_proc of REF_INT negative");
                                    ref_interp_local._4_4_ = 1;
                                  }
                                  else {
                                    recv_proc = (REF_INT *)malloc((long)local_158 << 2);
                                    if (recv_proc == (REF_INT *)0x0) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                             ,0x4e4,"ref_interp_tree",
                                             "malloc my_proc of REF_INT NULL");
                                      ref_interp_local._4_4_ = 2;
                                    }
                                    else {
                                      for (ref_private_macro_code_rss_8 = 0;
                                          ref_private_macro_code_rss_8 < local_158;
                                          ref_private_macro_code_rss_8 =
                                               ref_private_macro_code_rss_8 + 1) {
                                        recv_proc[ref_private_macro_code_rss_8] = ref_mpi_00->id;
                                      }
                                      local_158 = 0;
                                      for (best_node._4_4_ = 0; best_node._4_4_ < nrecv;
                                          best_node._4_4_ = best_node._4_4_ + 1) {
                                        if (ref_mpi_00->id ==
                                            *(int *)((long)best_bary + (long)best_node._4_4_ * 4)) {
                                          my_proc[local_158] = _nsend[best_node._4_4_];
                                          recv_node[local_158] = best_cell[best_node._4_4_];
                                          recv_cell[local_158] = from_proc[best_node._4_4_];
                                          if (recv_cell[local_158] == -1) {
                                            *increase_fuzz = 1;
                                          }
                                          else {
                                            uVar3 = ref_cell_nodes((REF_CELL)to_node,
                                                                   from_proc[best_node._4_4_],
                                                                   &local_f8);
                                            if (uVar3 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x4f0,"ref_interp_tree",(ulong)uVar3,
                                                  "cell should be set and valid");
                                              printf("global %d best cell %d best bary %e\n",
                                                     pRStack_120[best_node._4_4_],
                                                     (ulong)(uint)best_cell[best_node._4_4_],
                                                     (ulong)(uint)from_proc[best_node._4_4_]);
                                              return uVar3;
                                            }
                                            if (pRVar1->twod == 0) {
                                              uVar3 = ref_node_bary4(ref_node,&local_f8,
                                                                     (REF_DBL *)
                                                                     (local_node +
                                                                     (long)(best_node._4_4_ * 3) * 2
                                                                     ),recv_bary + (local_158 << 2))
                                              ;
                                              if (uVar3 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x4f9,"ref_interp_tree",(ulong)uVar3,"bary");
                                                return uVar3;
                                              }
                                            }
                                            else {
                                              recv_bary[local_158 * 4 + 3] = 0.0;
                                              uVar3 = ref_node_bary3(ref_node,&local_f8,
                                                                     (REF_DBL *)
                                                                     (local_node +
                                                                     (long)(best_node._4_4_ * 3) * 2
                                                                     ),recv_bary + (local_158 << 2))
                                              ;
                                              if (uVar3 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x4f5,"ref_interp_tree",(ulong)uVar3,"bary");
                                                return uVar3;
                                              }
                                            }
                                          }
                                          local_158 = local_158 + 1;
                                        }
                                      }
                                      ref_interp_local._4_4_ =
                                           ref_mpi_blindsend(ref_mpi_00,my_proc,recv_node,1,
                                                             local_158,&send_bary,
                                                             (REF_INT *)((long)&send_proc + 4),1);
                                      if (ref_interp_local._4_4_ == 0) {
                                        ref_interp_local._4_4_ =
                                             ref_mpi_blindsend(ref_mpi_00,my_proc,recv_cell,1,
                                                               local_158,&send_node,
                                                               (REF_INT *)((long)&send_proc + 4),1);
                                        if (ref_interp_local._4_4_ == 0) {
                                          ref_interp_local._4_4_ =
                                               ref_mpi_blindsend(ref_mpi_00,my_proc,recv_proc,1,
                                                                 local_158,&send_cell,
                                                                 (REF_INT *)((long)&send_proc + 4),1
                                                                );
                                          if (ref_interp_local._4_4_ == 0) {
                                            ref_interp_local._4_4_ =
                                                 ref_mpi_blindsend(ref_mpi_00,my_proc,recv_bary,4,
                                                                   local_158,(void **)&item,
                                                                   (REF_INT *)((long)&send_proc + 4)
                                                                   ,3);
                                            if (ref_interp_local._4_4_ == 0) {
                                              for (ref_private_macro_code_rss_1 = 0;
                                                  ref_private_macro_code_rss_1 < send_proc._4_4_;
                                                  ref_private_macro_code_rss_1 =
                                                       ref_private_macro_code_rss_1 + 1) {
                                                ref_interp->n_tree = ref_interp->n_tree + 1;
                                                best_node._4_4_ =
                                                     *(int *)((long)send_bary +
                                                             (long)ref_private_macro_code_rss_1 * 4)
                                                ;
                                                if ((long)ref_interp->cell[best_node._4_4_] != -1) {
                                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x512,"ref_interp_tree","tree already found?",
                                                  0xffffffffffffffff,
                                                  (long)ref_interp->cell[best_node._4_4_]);
                                                  return 1;
                                                }
                                                if (ref_interp->agent_hired[best_node._4_4_] != 0) {
                                                  uVar3 = ref_agents_delete(ref_interp->ref_agents,
                                                                            best_node._4_4_);
                                                  if (uVar3 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x514,"ref_interp_tree",(ulong)uVar3,"deq");
                                                  return uVar3;
                                                  }
                                                  ref_interp->agent_hired[best_node._4_4_] = 0;
                                                }
                                                ref_interp->cell[best_node._4_4_] =
                                                     send_node[ref_private_macro_code_rss_1];
                                                ref_interp->part[best_node._4_4_] =
                                                     send_cell[ref_private_macro_code_rss_1];
                                                if (send_node[ref_private_macro_code_rss_1] == -1) {
                                                  ref_interp->n_tree = ref_interp->n_tree + -1;
                                                }
                                                else {
                                                  for (ref_private_macro_code_rss = 0;
                                                      ref_private_macro_code_rss < 4;
                                                      ref_private_macro_code_rss =
                                                           ref_private_macro_code_rss + 1) {
                                                    ref_interp->bary
                                                    [ref_private_macro_code_rss +
                                                     best_node._4_4_ * 4] =
                                                         *(REF_DBL *)
                                                          ((long)_item +
                                                          (long)(ref_private_macro_code_rss +
                                                                ref_private_macro_code_rss_1 * 4) *
                                                          8);
                                                  }
                                                }
                                              }
                                              ref_interp_local._4_4_ =
                                                   ref_mpi_allsum(ref_mpi_00,&ref_interp->n_tree,1,1
                                                                 );
                                              if (ref_interp_local._4_4_ == 0) {
                                                ref_interp_local._4_4_ =
                                                     ref_mpi_all_or(ref_mpi_00,increase_fuzz);
                                                if (ref_interp_local._4_4_ == 0) {
                                                  if (send_bary != (REF_DBL *)0x0) {
                                                    free(send_bary);
                                                  }
                                                  if (send_node != (REF_INT *)0x0) {
                                                    free(send_node);
                                                  }
                                                  if (send_cell != (REF_INT *)0x0) {
                                                    free(send_cell);
                                                  }
                                                  if (_item != (void *)0x0) {
                                                    free(_item);
                                                  }
                                                  if (recv_bary != (REF_DBL *)0x0) {
                                                    free(recv_bary);
                                                  }
                                                  if (recv_proc != (REF_INT *)0x0) {
                                                    free(recv_proc);
                                                  }
                                                  if (recv_cell != (REF_INT *)0x0) {
                                                    free(recv_cell);
                                                  }
                                                  if (recv_node != (REF_INT *)0x0) {
                                                    free(recv_node);
                                                  }
                                                  if (my_proc != (REF_INT *)0x0) {
                                                    free(my_proc);
                                                  }
                                                  if (best_bary != (REF_DBL *)0x0) {
                                                    free(best_bary);
                                                  }
                                                  if (from_proc != (REF_INT *)0x0) {
                                                    free(from_proc);
                                                  }
                                                  if (best_cell != (REF_INT *)0x0) {
                                                    free(best_cell);
                                                  }
                                                  if (pRStack_120 != (REF_DBL *)0x0) {
                                                    free(pRStack_120);
                                                  }
                                                  if (_nsend != (REF_INT *)0x0) {
                                                    free(_nsend);
                                                  }
                                                  if (source != (REF_INT *)0x0) {
                                                    free(source);
                                                  }
                                                  if (local_node != (REF_INT *)0x0) {
                                                    free(local_node);
                                                  }
                                                  if (global_xyz != (REF_DBL *)0x0) {
                                                    free(global_xyz);
                                                  }
                                                  if (global_node != (REF_INT *)0x0) {
                                                    free(global_node);
                                                  }
                                                  ref_interp_local._4_4_ = ref_list_free(local_80);
                                                  if (ref_interp_local._4_4_ == 0) {
                                                    if (*increase_fuzz == 0) {
                                                      for (best_node._4_4_ = 0;
                                                          best_node._4_4_ < pRVar2->max;
                                                          best_node._4_4_ = best_node._4_4_ + 1) {
                                                        if (((((-1 < best_node._4_4_) &&
                                                              (best_node._4_4_ < pRVar2->max)) &&
                                                             (-1 < pRVar2->global[best_node._4_4_]))
                                                            && ((pRVar2->ref_mpi->id ==
                                                                 pRVar2->part[best_node._4_4_] &&
                                                                (ref_interp->cell[best_node._4_4_]
                                                                 == -1)))) &&
                                                           (ref_interp->cell[best_node._4_4_] == -1)
                                                           ) {
                                                          printf("%s: %d: %s: %s\n",
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x540,"ref_interp_tree","node missed by tree");
                                                  return 1;
                                                  }
                                                  }
                                                  }
                                                  ref_interp_local._4_4_ = 0;
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x53a,"ref_interp_tree",
                                                  (ulong)ref_interp_local._4_4_,"free list");
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x522,"ref_interp_tree",
                                                  (ulong)ref_interp_local._4_4_,"sync status");
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x521,"ref_interp_tree",
                                                  (ulong)ref_interp_local._4_4_,"as");
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x50d,"ref_interp_tree",
                                                  (ulong)ref_interp_local._4_4_,"blind send bary");
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x50a,"ref_interp_tree",
                                                  (ulong)ref_interp_local._4_4_,"blind send proc");
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                 ,0x507,"ref_interp_tree",
                                                 (ulong)ref_interp_local._4_4_,"blind send cell");
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                               ,0x504,"ref_interp_tree",
                                               (ulong)ref_interp_local._4_4_,"blind send node");
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x4da,"ref_interp_tree",(ulong)ref_interp_local._4_4_,"who");
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x4b5,"ref_interp_tree",(ulong)ref_interp_local._4_4_,"cat");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x4b1,"ref_interp_tree",(ulong)ref_interp_local._4_4_,"cat");
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x49b,
           "ref_interp_tree",(ulong)ref_interp_local._4_4_,"create list");
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_tree(REF_INTERP ref_interp,
                                          REF_BOOL *increase_fuzz) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_SEARCH ref_search = ref_interp_search(ref_interp);
  REF_DBL bary[4];
  REF_LIST ref_list;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, *best_node, *best_cell, *from_proc;
  REF_DBL *best_bary;
  REF_INT ntarget;
  REF_DBL *local_xyz, *global_xyz;
  REF_INT *local_node, *global_node;
  REF_INT *source, total_node;
  REF_INT nsend, nrecv;
  REF_INT *send_proc, *my_proc, *recv_proc;
  REF_INT *send_cell, *recv_cell;
  REF_INT *send_node, *recv_node;
  REF_DBL *send_bary, *recv_bary;
  REF_INT i, item;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  *increase_fuzz = REF_FALSE;

  RSS(ref_list_create(&ref_list), "create list");

  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    ntarget++;
  }
  ref_malloc(local_node, ntarget, REF_INT);
  ref_malloc(local_xyz, 3 * ntarget, REF_DBL);
  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    local_node[ntarget] = node;
    local_xyz[0 + 3 * ntarget] = ref_node_xyz(to_node, 0, node);
    local_xyz[1 + 3 * ntarget] = ref_node_xyz(to_node, 1, node);
    local_xyz[2 + 3 * ntarget] = ref_node_xyz(to_node, 2, node);
    ntarget++;
  }
  RSS(ref_mpi_allconcat(ref_mpi, 3, ntarget, (void *)local_xyz, &total_node,
                        &source, (void **)&global_xyz, REF_DBL_TYPE),
      "cat");
  ref_free(source);
  RSS(ref_mpi_allconcat(ref_mpi, 1, ntarget, (void *)local_node, &total_node,
                        &source, (void **)&global_node, REF_INT_TYPE),
      "cat");

  ref_malloc(best_bary, total_node, REF_DBL);
  ref_malloc(best_node, total_node, REF_INT);
  ref_malloc(best_cell, total_node, REF_INT);
  ref_malloc(from_proc, total_node, REF_INT);
  for (node = 0; node < total_node; node++) {
    best_node[node] = global_node[node];
    best_cell[node] = REF_EMPTY;
    best_bary[node] = 1.0e20; /* negative for min, until use max*/
    RSS(ref_search_touching(ref_search, ref_list, &(global_xyz[3 * node]),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      if (ref_grid_twod(from_grid)) {
        RSS(ref_interp_enclosing_tri_in_list(ref_interp, ref_list,
                                             &(global_xyz[3 * node]),
                                             &(best_cell[node]), bary),
            "best in list");
      } else {
        RSS(ref_interp_enclosing_tet_in_list(ref_interp, ref_list,
                                             &(global_xyz[3 * node]),
                                             &(best_cell[node]), bary),
            "best in list");
      }
      if (REF_EMPTY != best_cell[node]) {
        /* negative for min, until use max*/
        best_bary[node] = -MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
      }
    } else {
      best_cell[node] = REF_EMPTY;
    }
    (ref_interp->tree_cells) += ref_list_n(ref_list);
    RSS(ref_list_erase(ref_list), "reset list");
  }

  /* negative for min, until use max*/
  RSS(ref_mpi_allminwho(ref_mpi, best_bary, from_proc, total_node), "who");

  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) nsend++;

  ref_malloc(send_bary, 4 * nsend, REF_DBL);
  ref_malloc(send_cell, nsend, REF_INT);
  ref_malloc(send_node, nsend, REF_INT);
  ref_malloc(send_proc, nsend, REF_INT);
  ref_malloc_init(my_proc, nsend, REF_INT, ref_mpi_rank(ref_mpi));
  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) {
      send_proc[nsend] = source[node];
      send_node[nsend] = best_node[node];
      send_cell[nsend] = best_cell[node];
      if (REF_EMPTY != send_cell[nsend]) {
        RSB(ref_cell_nodes(from_cell, best_cell[node], nodes),
            "cell should be set and valid", {
              printf("global %d best cell %d best bary %e\n", best_node[node],
                     best_cell[node], best_bary[node]);
            });
        if (ref_grid_twod(from_grid)) {
          send_bary[3 + 4 * nsend] = 0.0;
          RSS(ref_node_bary3(from_node, nodes, &(global_xyz[3 * node]),
                             &(send_bary[4 * nsend])),
              "bary");
        } else {
          RSS(ref_node_bary4(from_node, nodes, &(global_xyz[3 * node]),
                             &(send_bary[4 * nsend])),
              "bary");
        }
      } else {
        *increase_fuzz =
            REF_TRUE; /* candidate not found, try again larger fuzz */
      }
      nsend++;
    }

  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_node, 1, nsend,
                        (void **)(&recv_node), &nrecv, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_cell, 1, nsend,
                        (void **)(&recv_cell), &nrecv, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)my_proc, 1, nsend,
                        (void **)(&recv_proc), &nrecv, REF_INT_TYPE),
      "blind send proc");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_bary, 4, nsend,
                        (void **)(&recv_bary), &nrecv, REF_DBL_TYPE),
      "blind send bary");

  for (item = 0; item < nrecv; item++) {
    (ref_interp->n_tree)++;
    node = recv_node[item];
    REIS(REF_EMPTY, ref_interp->cell[node], "tree already found?");
    if (ref_interp->agent_hired[node]) { /* need to dequeue */
      RSS(ref_agents_delete(ref_interp->ref_agents, node), "deq");
      ref_interp->agent_hired[node] = REF_FALSE;
    }
    ref_interp->cell[node] = recv_cell[item];
    ref_interp->part[node] = recv_proc[item];
    if (REF_EMPTY != recv_cell[item]) {
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * node] = recv_bary[i + 4 * item];
    } else {
      (ref_interp->n_tree)--;
    }
  }

  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_tree), 1, REF_INT_TYPE), "as");
  RSS(ref_mpi_all_or(ref_mpi, increase_fuzz), "sync status");

  ref_free(recv_node);
  ref_free(recv_cell);
  ref_free(recv_proc);
  ref_free(recv_bary);

  ref_free(send_bary);
  ref_free(my_proc);
  ref_free(send_cell);
  ref_free(send_node);
  ref_free(send_proc);

  ref_free(from_proc);
  ref_free(best_cell);
  ref_free(best_node);
  ref_free(best_bary);

  ref_free(source);
  ref_free(global_node);
  ref_free(global_xyz);
  ref_free(local_xyz);
  ref_free(local_node);

  RSS(ref_list_free(ref_list), "free list");

  if (!(*increase_fuzz)) {
    each_ref_node_valid_node(to_node, node) {
      if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
        continue;
      RUS(REF_EMPTY, ref_interp->cell[node], "node missed by tree");
    }
  }

  return REF_SUCCESS;
}